

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O1

void generate_stats(int *st,int *spent,int *inc,int *left)

{
  player_class *ppVar1;
  int iVar2;
  _Bool _Var3;
  uint uVar4;
  int *extraout_RDX;
  int *extraout_RDX_00;
  int *extraout_RDX_01;
  int *extraout_RDX_02;
  byte bVar5;
  wchar_t wVar6;
  int *in_R8;
  undefined1 in_R9B;
  int iVar7;
  int *piVar8;
  bool bVar9;
  undefined4 local_54;
  byte local_50;
  wchar_t local_4c;
  int local_48;
  wchar_t local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  
  local_50 = 0;
  local_54 = 0;
  ppVar1 = player->class;
  if ((ppVar1->magic).total_spells == L'\0') {
    local_4c = L'\0';
  }
  else {
    local_4c = ((ppVar1->magic).books)->realm->stat;
    left = (int *)(ulong)(uint)local_4c;
  }
  if (points_left != L'\0') {
    local_44 = ppVar1->max_attacks;
    piVar8 = (int *)(long)local_4c;
    local_38 = (ulong)(uint)local_4c;
    iVar7 = 0;
    local_3c = 10;
    local_40 = 10;
    do {
      switch(iVar7) {
      case 0:
        if (((char)local_54 == '\0') && (stats[0] < 0x11)) {
          _Var3 = buy_stat(L'\0',(int *)0x0,inc,left,in_R8,(_Bool)in_R9B);
          inc = extraout_RDX;
          if (!_Var3) {
            local_54 = CONCAT31(local_54._1_3_,1);
          }
        }
        else {
          iVar7 = iVar7 + 1;
          if (local_44 < L'\x05') {
            iVar7 = 3;
          }
        }
        break;
      case 1:
        if ((local_54._3_1_ != '\0') || (0x10 < stats[3])) goto LAB_001b5366;
        _Var3 = buy_stat(L'\x03',(int *)0x1,inc,left,in_R8,(_Bool)in_R9B);
        if (!_Var3) {
          local_54 = CONCAT13(1,(undefined3)local_54);
        }
        wVar6 = (player->state).num_blows;
        left = (int *)((ulong)(long)wVar6 >> 0x3f);
        iVar2 = wVar6 / 10;
        inc = extraout_RDX_01;
        if (local_40 < iVar2) {
          left = (int *)(ulong)(uint)stats[3];
          local_3c = stats[3];
          local_40 = iVar2;
        }
        break;
      case 2:
        if (local_3c < stats[3]) {
          left = (int *)(ulong)(uint)points_left;
          inc = (int *)(ulong)(uint)points_spent[3];
          uVar4 = stats[3];
          do {
            if (10 < (int)uVar4) {
              points_inc[3] = birth_stat_costs[uVar4];
              uVar4 = uVar4 - 1;
              points_spent[3] = (int)inc - points_inc[3];
              inc = (int *)(ulong)(uint)points_spent[3];
              points_left = (int)left + points_inc[3];
              left = (int *)(ulong)(uint)points_left;
              stats[3] = uVar4;
            }
          } while (local_3c < (int)uVar4);
          local_54 = local_54 & 0xffffff;
        }
LAB_001b5366:
        iVar7 = iVar7 + 1;
        break;
      case 3:
        bVar5 = local_50;
        wVar6 = points_left;
        if (local_44 < L'\x06') {
          wVar6 = points_left / 2;
          bVar5 = *(byte *)((long)&local_54 + (long)piVar8);
          if ((bVar5 & 1) == 0) {
            local_48 = iVar7;
            do {
              iVar7 = local_48;
              if (((L'\x04' < local_44) && (0x11 < stats[(long)piVar8])) ||
                 (wVar6 <= points_spent[(long)piVar8])) break;
              bVar9 = (uint)local_4c < 5;
              _Var3 = buy_stat(local_4c,(int *)0x0,inc,left,in_R8,(_Bool)in_R9B);
              left = (int *)0x1;
              if (!_Var3) {
                bVar5 = 1;
              }
              if (wVar6 < points_spent[(long)piVar8]) {
                bVar5 = 1;
              }
              if (wVar6 < points_spent[(long)piVar8] && bVar9) {
                iVar7 = stats[local_38];
                bVar5 = 1;
                if (10 < (long)iVar7) {
                  uVar4 = birth_stat_costs[iVar7];
                  left = (int *)(ulong)uVar4;
                  stats[local_38] = iVar7 + -1;
                  points_spent[local_38] = points_spent[local_38] - uVar4;
                  points_inc[local_38] = uVar4;
                  points_left = points_left + uVar4;
                }
              }
              inc = piVar8;
              iVar7 = local_48;
            } while ((bVar5 & 1) == 0);
          }
          *(byte *)((long)&local_54 + (long)piVar8) = bVar5;
          bVar5 = local_50;
        }
        while ((((bVar5 & 1) == 0 && (stats[4] < 0x10)) && (points_spent[4] < wVar6))) {
          _Var3 = buy_stat(L'\x04',(int *)0x0,inc,left,in_R8,(_Bool)in_R9B);
          if (!_Var3) {
            bVar5 = 1;
          }
          inc = extraout_RDX_02;
          if (wVar6 < points_spent[4]) {
            left = (int *)(long)stats[4];
            bVar5 = 1;
            if (10 < (long)left) {
              points_inc[4] = birth_stat_costs[(long)left];
              inc = (int *)(ulong)(uint)points_inc[4];
              stats[4] = stats[4] - 1;
              left = (int *)(ulong)(uint)stats[4];
              points_spent[4] = points_spent[4] - points_inc[4];
              points_left = points_left + points_inc[4];
            }
          }
        }
        local_50 = bVar5;
        iVar7 = iVar7 + 1;
        break;
      case 4:
        wVar6 = L'\x03';
        if (((local_54._3_1_ == '\x01') &&
            ((local_54._1_1_ != '\0' || (wVar6 = L'\x01', local_4c == L'\x01')))) &&
           ((local_54._2_1_ != '\0' || (wVar6 = L'\x02', local_4c == L'\x02')))) goto LAB_001b5366;
        do {
          _Var3 = buy_stat(wVar6,(int *)0x0,inc,left,in_R8,(_Bool)in_R9B);
          inc = extraout_RDX_00;
        } while (_Var3);
        *(undefined1 *)((long)&local_54 + (ulong)(uint)wVar6) = 1;
        break;
      default:
        iVar7 = -1;
      }
    } while ((points_left != L'\0') && (-1 < iVar7));
  }
  wVar6 = L'\x00296880';
  event_signal_birthpoints(points_spent,points_inc,points_left);
  recalculate_stats((int *)(ulong)(uint)points_left,wVar6);
  return;
}

Assistant:

static void generate_stats(int st[STAT_MAX], int spent[STAT_MAX],
		int inc[STAT_MAX], int *left)
{
	int step = 0;
	bool maxed[STAT_MAX] = { 0 };
	/* Hack - for now, just use stat of first book - NRM */
	int spell_stat = player->class->magic.total_spells ?
		player->class->magic.books[0].realm->stat : 0;
	bool caster = player->class->max_attacks < 5 ? true : false;
	bool warrior = player->class->max_attacks > 5 ? true : false;
	int blows = 10;
	int dex_break = 10;

	while (*left && step >= 0) {
	
		switch (step) {
		
			/* Buy base STR 17 */
			case 0: {
			
				if (!maxed[STAT_STR] && st[STAT_STR] < 17) {
					if (!buy_stat(STAT_STR, st, spent, inc,
							left, false))
						maxed[STAT_STR] = true;
				} else {
					step++;
					
					/* If pure caster skip to step 3 */
					if (caster) {
						step = 3;
					}
				}

				break;
			}

			/* Buy base DEX of 17, record best breakpoint */
			case 1: {
				if (!maxed[STAT_DEX] && st[STAT_DEX] < 17) {
					if (!buy_stat(STAT_DEX, st, spent, inc,
							left, true)) {
						maxed[STAT_DEX] = true;
					}
					if (player->state.num_blows / 10 > blows) {
						blows = player->state.num_blows / 10;
						dex_break = st[STAT_DEX];
					}
				} else {
					step++;
				}

				break;
			}

			/* Sell back DEX that isn't getting us an extra blow. */
			case 2: {
				while (st[STAT_DEX] > dex_break) {
					sell_stat(STAT_DEX, st, spent, inc,
						left, false);
					maxed[STAT_DEX] = false;
				}
				step++;
				break;
			}

			/* 
			 * Spend up to half remaining points on each of spell-stat and 
			 * con, but only up to max base of 16 unless a pure class 
			 * [caster or warrior]
			 */
			case 3: 
			{
				int points_trigger = *left / 2;
				
				if (warrior) {
					points_trigger = *left;
				} else {
					while (!maxed[spell_stat] &&
						   (caster || st[spell_stat] < 18) &&
						   spent[spell_stat] < points_trigger) {

						if (!buy_stat(spell_stat, st,
								spent, inc,
								left, false)) {
							maxed[spell_stat] = true;
						}

						if (spent[spell_stat] > points_trigger) {
						
							sell_stat(spell_stat,
								st, spent, inc,
								left, false);
							maxed[spell_stat] = true;
						}
					}
				}

				while (!maxed[STAT_CON] &&
					   st[STAT_CON] < 16 &&
					   spent[STAT_CON] < points_trigger) {
					   
					if (!buy_stat(STAT_CON, st, spent, inc,
							left, false)) {
						maxed[STAT_CON] = true;
					}

					if (spent[STAT_CON] > points_trigger) {
						sell_stat(STAT_CON, st, spent,
							inc, left, false);
						maxed[STAT_CON] = true;
					}
				}
				
				step++;
				break;
			}

			/* 
			 * If there are any points left, spend as much as possible in 
			 * order on DEX, and the non-spell-stat. 
			 */
			case 4:{
			
				int next_stat;

				if (!maxed[STAT_DEX]) {
					next_stat = STAT_DEX;
				} else if (!maxed[STAT_INT] && spell_stat != STAT_INT) {
					next_stat = STAT_INT;
				} else if (!maxed[STAT_WIS] && spell_stat != STAT_WIS) {
					next_stat = STAT_WIS;
				} else {
					step++;
					break;
				}

				/* Buy until we can't buy any more. */
				while (buy_stat(next_stat, st, spent, inc, left,
						false));
				maxed[next_stat] = true;

				break;
			}

			default: {
			
				step = -1;
				break;
			}
		}
	}
	/* Tell the UI the new points situation. */
	event_signal_birthpoints(spent, inc, *left);

	/* Recalculate everything that's changed because
	   the stat has changed, and inform the UI. */
	recalculate_stats(st, *left);
}